

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1089::run(TestCase1089 *this)

{
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  PointerBuilder builder_03;
  PointerBuilder builder_04;
  PointerBuilder builder_05;
  PointerBuilder builder_06;
  PointerBuilder builder_07;
  PointerBuilder builder_08;
  Builder reader;
  Builder root_00;
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder root_01;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder root_02;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder root_03;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder root_04;
  Builder reader_15;
  Builder reader_16;
  Builder root_05;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder root_06;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  Builder reader_27;
  Builder reader_28;
  Builder reader_29;
  Builder reader_30;
  Reader reader_31;
  Reader reader_32;
  Reader reader_33;
  Reader reader_34;
  Reader reader_35;
  Reader reader_36;
  Reader reader_37;
  Reader reader_38;
  Reader reader_39;
  Reader reader_40;
  Reader reader_41;
  Reader reader_42;
  Reader reader_43;
  Reader reader_44;
  Reader reader_45;
  WirePointer *pWVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  size_type sVar5;
  initializer_list<capnp::Void> list;
  Reader value;
  Reader value_00;
  Reader value_01;
  initializer_list<capnp::Void> list_00;
  initializer_list<capnp::Void> list_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  initializer_list<capnp::Void> expected;
  initializer_list<long> expectedData;
  ArrayPtr<const_bool> value_06;
  initializer_list<bool> expected_00;
  initializer_list<bool> expected_01;
  ArrayPtr<const_unsigned_char> value_07;
  initializer_list<capnp::Void> expected_02;
  initializer_list<unsigned_char> expected_03;
  initializer_list<unsigned_char> expected_04;
  initializer_list<long> expectedData_00;
  initializer_list<unsigned_char> expected_05;
  ArrayPtr<const_unsigned_short> value_08;
  initializer_list<capnp::Void> expected_06;
  initializer_list<unsigned_char> expected_07;
  initializer_list<unsigned_short> expected_08;
  initializer_list<unsigned_short> expected_09;
  initializer_list<long> expectedData_01;
  initializer_list<unsigned_short> expected_10;
  ArrayPtr<const_unsigned_int> value_09;
  initializer_list<capnp::Void> expected_11;
  initializer_list<unsigned_char> expected_12;
  initializer_list<unsigned_short> expected_13;
  initializer_list<unsigned_int> expected_14;
  initializer_list<unsigned_int> expected_15;
  initializer_list<long> expectedData_02;
  initializer_list<unsigned_int> expected_16;
  ArrayPtr<const_unsigned_long> value_10;
  initializer_list<capnp::Void> expected_17;
  initializer_list<unsigned_char> expected_18;
  initializer_list<unsigned_short> expected_19;
  initializer_list<unsigned_int> expected_20;
  initializer_list<unsigned_long> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<long> expectedData_03;
  initializer_list<unsigned_long> expected_23;
  ArrayPtr<const_capnp::Text::Reader> value_11;
  initializer_list<capnp::Void> expected_24;
  initializer_list<capnp::Text::Reader> expected_25;
  initializer_list<capnp::Text::Reader> expected_26;
  initializer_list<long> expectedData_04;
  initializer_list<capnp::Text::Reader> expected_27;
  initializer_list<capnp::Void> expected_28;
  initializer_list<unsigned_char> expected_29;
  initializer_list<unsigned_short> expected_30;
  initializer_list<unsigned_int> expected_31;
  initializer_list<unsigned_long> expected_32;
  initializer_list<capnp::Text::Reader> expected_33;
  initializer_list<long> expectedData_05;
  initializer_list<long> expectedData_06;
  initializer_list<long> expectedData_07;
  ArrayPtr<const_unsigned_short> value_12;
  initializer_list<unsigned_short> expected_34;
  initializer_list<unsigned_short> expected_35;
  initializer_list<unsigned_char> expected_36;
  initializer_list<unsigned_short> expected_37;
  initializer_list<unsigned_int> expected_38;
  initializer_list<unsigned_long> expected_39;
  initializer_list<unsigned_short> expected_40;
  initializer_list<unsigned_int> expected_41;
  initializer_list<unsigned_long> expected_42;
  initializer_list<capnp::Text::Reader> expected_43;
  ArrayPtr<const_capnp::Text::Reader> value_13;
  ArrayPtr<const_unsigned_int> value_14;
  initializer_list<capnp::Text::Reader> expectedPointers;
  initializer_list<capnp::Text::Reader> expectedPointers_00;
  initializer_list<capnp::Text::Reader> expectedPointers_01;
  initializer_list<capnp::Text::Reader> expectedPointers_02;
  initializer_list<capnp::Text::Reader> expectedPointers_03;
  initializer_list<capnp::Text::Reader> expectedPointers_04;
  initializer_list<capnp::Text::Reader> expectedPointers_05;
  initializer_list<capnp::Text::Reader> expectedPointers_06;
  initializer_list<capnp::Text::Reader> expectedPointers_07;
  uint local_81c;
  ReaderFor<capnp::List<bool,_(capnp::Kind)0>_> orig;
  Builder root;
  Fault f;
  uint local_78c;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> l;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_620;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_5f8;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_5d0;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_5a8;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_580;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_558;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_530;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_508;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_4e0;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_4b8;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_490;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_468;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_440;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_418;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_3f0;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_3c8;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_3a0;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_378;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_350;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_328;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_300;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_2d8;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_2b0;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_288;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_260;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_238;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_210;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_1e8;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_1c0;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_198;
  BuilderFor<capnp::List<bool,_(capnp::Kind)0>_> local_170;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_148;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  list._M_len = 4;
  list._M_array = (iterator)&orig;
  AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>((Builder *)&l,list);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_148,(Builder *)&l);
  reader.builder.capTable = local_148.builder.capTable;
  reader.builder.segment = local_148.builder.segment;
  reader.builder.ptr = local_148.builder.ptr;
  reader.builder.elementCount = local_148.builder.elementCount;
  reader.builder.step = local_148.builder.step;
  reader.builder.structDataSize = local_148.builder.structDataSize;
  reader.builder.structPointerCount = local_148.builder.structPointerCount;
  reader.builder.elementSize = local_148.builder.elementSize;
  reader.builder._39_1_ = local_148.builder._39_1_;
  expected._M_len = 4;
  expected._M_array = (iterator)&orig;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader,expected);
  orig.reader.segment = (SegmentReader *)&PTR_run_00391970;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,1099,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_003919a0;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_003919d0;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44d,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_00391a00;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_00391a30;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x44f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_00391a60;
  orig.reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x450,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  orig.reader.ptr = (byte *)0x0;
  orig.reader.elementCount = 0;
  orig.reader.step = 0;
  orig.reader.segment = (SegmentReader *)0x0;
  orig.reader.capTable = (CapTableReader *)0x0;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  root_00._builder.capTable = root._builder.capTable;
  root_00._builder.segment = root._builder.segment;
  root_00._builder.data = root._builder.data;
  root_00._builder.pointers = root._builder.pointers;
  root_00._builder.dataSize = root._builder.dataSize;
  root_00._builder.pointerCount = root._builder.pointerCount;
  root_00._builder._38_2_ = root._builder._38_2_;
  expectedData._M_len = 4;
  expectedData._M_array = (iterator)&orig;
  expectedPointers._M_len = 1;
  expectedPointers._M_array = (iterator)&l;
  checkUpgradedList(root_00,expectedData,expectedPointers);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)CONCAT44(orig.reader.segment._4_4_,0x1010001);
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = root._builder.pointers;
  value_06.size_ = 4;
  value_06.ptr = (bool *)&orig;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value_06);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<bool,(capnp::Kind)0>>(&orig,(Reader *)&f);
  f.exception = (Exception *)&PTR_run_00391a90;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x458,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<bool,(capnp::Kind)0>>(&local_170,(Builder *)&l);
  f.exception._0_4_ = 0x1010001;
  reader_00.builder.capTable = local_170.builder.capTable;
  reader_00.builder.segment = local_170.builder.segment;
  reader_00.builder.ptr = local_170.builder.ptr;
  reader_00.builder.elementCount = local_170.builder.elementCount;
  reader_00.builder.step = local_170.builder.step;
  reader_00.builder.structDataSize = local_170.builder.structDataSize;
  reader_00.builder.structPointerCount = local_170.builder.structPointerCount;
  reader_00.builder.elementSize = local_170.builder.elementSize;
  reader_00.builder._39_1_ = local_170.builder._39_1_;
  expected_00._M_len = 4;
  expected_00._M_array = (iterator)&f;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_00,expected_00);
  f.exception = (Exception *)&PTR_run_00391ac0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45a,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391af0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45b,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391b20;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391b50;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45d,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391b80;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x45e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = (SegmentBuilder *)CONCAT44(l.builder.segment._4_4_,0x1010001);
  reader_31.reader.structPointerCount = orig.reader.structPointerCount;
  reader_31.reader.structDataSize = orig.reader.structDataSize;
  reader_31.reader.elementSize = orig.reader.elementSize;
  reader_31.reader._39_1_ = orig.reader._39_1_;
  reader_31.reader._44_4_ = orig.reader._44_4_;
  reader_31.reader.nestingLimit = orig.reader.nestingLimit;
  reader_31.reader.capTable = orig.reader.capTable;
  reader_31.reader.segment = orig.reader.segment;
  reader_31.reader.ptr = orig.reader.ptr;
  reader_31.reader.elementCount = orig.reader.elementCount;
  reader_31.reader.step = orig.reader.step;
  expected_01._M_len = 4;
  expected_01._M_array = (iterator)&l;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_31,expected_01);
  f.exception = (Exception *)&PTR_run_00391bb0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[128]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x463,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr\""
               ,(char (*) [128])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)CONCAT44(orig.reader.segment._4_4_,0x44332312);
  builder_01.capTable = root._builder.capTable;
  builder_01.segment = root._builder.segment;
  builder_01.pointer = root._builder.pointers;
  value_07.size_ = 4;
  value_07.ptr = (uchar *)&orig;
  PointerHelpers<capnp::List<unsigned_char,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_01,value_07);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> *)&orig,(Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_198,(Builder *)&l);
  reader_01.builder.capTable = local_198.builder.capTable;
  reader_01.builder.segment = local_198.builder.segment;
  reader_01.builder.ptr = local_198.builder.ptr;
  reader_01.builder.elementCount = local_198.builder.elementCount;
  reader_01.builder.step = local_198.builder.step;
  reader_01.builder.structDataSize = local_198.builder.structDataSize;
  reader_01.builder.structPointerCount = local_198.builder.structPointerCount;
  reader_01.builder.elementSize = local_198.builder.elementSize;
  reader_01.builder._39_1_ = local_198.builder._39_1_;
  expected_02._M_len = 4;
  expected_02._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_01,expected_02);
  f.exception = (Exception *)&PTR_run_00391be0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46c,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_1c0,(Builder *)&l);
  f.exception._0_4_ = 0x44332312;
  reader_02.builder.capTable = local_1c0.builder.capTable;
  reader_02.builder.segment = local_1c0.builder.segment;
  reader_02.builder.ptr = local_1c0.builder.ptr;
  reader_02.builder.elementCount = local_1c0.builder.elementCount;
  reader_02.builder.step = local_1c0.builder.step;
  reader_02.builder.structDataSize = local_1c0.builder.structDataSize;
  reader_02.builder.structPointerCount = local_1c0.builder.structPointerCount;
  reader_02.builder.elementSize = local_1c0.builder.elementSize;
  reader_02.builder._39_1_ = local_1c0.builder._39_1_;
  expected_03._M_len = 4;
  expected_03._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_03);
  f.exception = (Exception *)&PTR_run_00391c10;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391c40;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x46f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391c70;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x470,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391ca0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x471,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = (SegmentBuilder *)CONCAT44(l.builder.segment._4_4_,0x44332312);
  reader_32.reader.structPointerCount = orig.reader.structPointerCount;
  reader_32.reader.structDataSize = orig.reader.structDataSize;
  reader_32.reader.elementSize = orig.reader.elementSize;
  reader_32.reader._39_1_ = orig.reader._39_1_;
  reader_32.reader._44_4_ = orig.reader._44_4_;
  reader_32.reader.nestingLimit = orig.reader.nestingLimit;
  reader_32.reader.capTable = orig.reader.capTable;
  reader_32.reader.segment = orig.reader.segment;
  reader_32.reader.ptr = orig.reader.ptr;
  reader_32.reader.elementCount = orig.reader.elementCount;
  reader_32.reader.step = orig.reader.step;
  expected_04._M_len = 4;
  expected_04._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_32,expected_04);
  f.exception = (Exception *)0x12;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  root_01._builder.capTable = root._builder.capTable;
  root_01._builder.segment = root._builder.segment;
  root_01._builder.data = root._builder.data;
  root_01._builder.pointers = root._builder.pointers;
  root_01._builder.dataSize = root._builder.dataSize;
  root_01._builder.pointerCount = root._builder.pointerCount;
  root_01._builder._38_2_ = root._builder._38_2_;
  expectedData_00._M_len = 4;
  expectedData_00._M_array = (iterator)&f;
  expectedPointers_00._M_len = 1;
  expectedPointers_00._M_array = (iterator)&l;
  checkUpgradedList(root_01,expectedData_00,expectedPointers_00);
  l.builder.segment = (SegmentBuilder *)((ulong)l.builder.segment & 0xffffffff00000000);
  reader_33.reader.structPointerCount = orig.reader.structPointerCount;
  reader_33.reader.structDataSize = orig.reader.structDataSize;
  reader_33.reader.elementSize = orig.reader.elementSize;
  reader_33.reader._39_1_ = orig.reader._39_1_;
  reader_33.reader._44_4_ = orig.reader._44_4_;
  reader_33.reader.nestingLimit = orig.reader.nestingLimit;
  reader_33.reader.capTable = orig.reader.capTable;
  reader_33.reader.segment = orig.reader.segment;
  reader_33.reader.ptr = orig.reader.ptr;
  reader_33.reader.elementCount = orig.reader.elementCount;
  reader_33.reader.step = orig.reader.step;
  expected_05._M_len = 4;
  expected_05._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_33,expected_05);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)0xcd44ab3378235612;
  builder_02.capTable = root._builder.capTable;
  builder_02.segment = root._builder.segment;
  builder_02.pointer = root._builder.pointers;
  value_08.size_ = 4;
  value_08.ptr = (unsigned_short *)&orig;
  PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_02,value_08);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> *)&orig,(Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_1e8,(Builder *)&l);
  reader_03.builder.capTable = local_1e8.builder.capTable;
  reader_03.builder.segment = local_1e8.builder.segment;
  reader_03.builder.ptr = local_1e8.builder.ptr;
  reader_03.builder.elementCount = local_1e8.builder.elementCount;
  reader_03.builder.step = local_1e8.builder.step;
  reader_03.builder.structDataSize = local_1e8.builder.structDataSize;
  reader_03.builder.structPointerCount = local_1e8.builder.structPointerCount;
  reader_03.builder.elementSize = local_1e8.builder.elementSize;
  reader_03.builder._39_1_ = local_1e8.builder._39_1_;
  expected_06._M_len = 4;
  expected_06._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_03,expected_06);
  f.exception = (Exception *)&PTR_run_00391cd0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x47e,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_210,(Builder *)&l);
  f.exception._0_4_ = 0x44332312;
  reader_04.builder.capTable = local_210.builder.capTable;
  reader_04.builder.segment = local_210.builder.segment;
  reader_04.builder.ptr = local_210.builder.ptr;
  reader_04.builder.elementCount = local_210.builder.elementCount;
  reader_04.builder.step = local_210.builder.step;
  reader_04.builder.structDataSize = local_210.builder.structDataSize;
  reader_04.builder.structPointerCount = local_210.builder.structPointerCount;
  reader_04.builder.elementSize = local_210.builder.elementSize;
  reader_04.builder._39_1_ = local_210.builder._39_1_;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_04,expected_07);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_238,(Builder *)&l);
  f.exception = (Exception *)0xcd44ab3378235612;
  reader_05.builder.capTable = local_238.builder.capTable;
  reader_05.builder.segment = local_238.builder.segment;
  reader_05.builder.ptr = local_238.builder.ptr;
  reader_05.builder.elementCount = local_238.builder.elementCount;
  reader_05.builder.step = local_238.builder.step;
  reader_05.builder.structDataSize = local_238.builder.structDataSize;
  reader_05.builder.structPointerCount = local_238.builder.structPointerCount;
  reader_05.builder.elementSize = local_238.builder.elementSize;
  reader_05.builder._39_1_ = local_238.builder._39_1_;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_05,expected_08);
  f.exception = (Exception *)&PTR_run_00391d00;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x481,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391d30;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x482,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391d60;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x483,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = (SegmentBuilder *)0xcd44ab3378235612;
  reader_34.reader.structPointerCount = orig.reader.structPointerCount;
  reader_34.reader.structDataSize = orig.reader.structDataSize;
  reader_34.reader.elementSize = orig.reader.elementSize;
  reader_34.reader._39_1_ = orig.reader._39_1_;
  reader_34.reader._44_4_ = orig.reader._44_4_;
  reader_34.reader.nestingLimit = orig.reader.nestingLimit;
  reader_34.reader.capTable = orig.reader.capTable;
  reader_34.reader.segment = orig.reader.segment;
  reader_34.reader.ptr = orig.reader.ptr;
  reader_34.reader.elementCount = orig.reader.elementCount;
  reader_34.reader.step = orig.reader.step;
  expected_09._M_len = 4;
  expected_09._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_34,expected_09);
  f.exception = (Exception *)0x5612;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  root_02._builder.capTable = root._builder.capTable;
  root_02._builder.segment = root._builder.segment;
  root_02._builder.data = root._builder.data;
  root_02._builder.pointers = root._builder.pointers;
  root_02._builder.dataSize = root._builder.dataSize;
  root_02._builder.pointerCount = root._builder.pointerCount;
  root_02._builder._38_2_ = root._builder._38_2_;
  expectedData_01._M_len = 4;
  expectedData_01._M_array = (iterator)&f;
  expectedPointers_01._M_len = 1;
  expectedPointers_01._M_array = (iterator)&l;
  checkUpgradedList(root_02,expectedData_01,expectedPointers_01);
  l.builder.segment = (SegmentBuilder *)0x0;
  reader_35.reader.structPointerCount = orig.reader.structPointerCount;
  reader_35.reader.structDataSize = orig.reader.structDataSize;
  reader_35.reader.elementSize = orig.reader.elementSize;
  reader_35.reader._39_1_ = orig.reader._39_1_;
  reader_35.reader._44_4_ = orig.reader._44_4_;
  reader_35.reader.nestingLimit = orig.reader.nestingLimit;
  reader_35.reader.capTable = orig.reader.capTable;
  reader_35.reader.segment = orig.reader.segment;
  reader_35.reader.ptr = orig.reader.ptr;
  reader_35.reader.elementCount = orig.reader.elementCount;
  reader_35.reader.step = orig.reader.step;
  expected_10._M_len = 4;
  expected_10._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_35,expected_10);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)0x2934782317595612;
  orig.reader.capTable = (CapTableReader *)0x1a39cd455923ab32;
  builder_03.capTable = root._builder.capTable;
  builder_03.segment = root._builder.segment;
  builder_03.pointer = root._builder.pointers;
  value_09.size_ = 4;
  value_09.ptr = (uint *)&orig;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_03,value_09);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&orig,(Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_260,(Builder *)&l);
  reader_06.builder.capTable = local_260.builder.capTable;
  reader_06.builder.segment = local_260.builder.segment;
  reader_06.builder.ptr = local_260.builder.ptr;
  reader_06.builder.elementCount = local_260.builder.elementCount;
  reader_06.builder.step = local_260.builder.step;
  reader_06.builder.structDataSize = local_260.builder.structDataSize;
  reader_06.builder.structPointerCount = local_260.builder.structPointerCount;
  reader_06.builder.elementSize = local_260.builder.elementSize;
  reader_06.builder._39_1_ = local_260.builder._39_1_;
  expected_11._M_len = 4;
  expected_11._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_06,expected_11);
  f.exception = (Exception *)&PTR_run_00391d90;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x490,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_288,(Builder *)&l);
  f.exception._0_4_ = 0x45322312;
  reader_07.builder.capTable = local_288.builder.capTable;
  reader_07.builder.segment = local_288.builder.segment;
  reader_07.builder.ptr = local_288.builder.ptr;
  reader_07.builder.elementCount = local_288.builder.elementCount;
  reader_07.builder.step = local_288.builder.step;
  reader_07.builder.structDataSize = local_288.builder.structDataSize;
  reader_07.builder.structPointerCount = local_288.builder.structPointerCount;
  reader_07.builder.elementSize = local_288.builder.elementSize;
  reader_07.builder._39_1_ = local_288.builder._39_1_;
  expected_12._M_len = 4;
  expected_12._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_07,expected_12);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2b0,(Builder *)&l);
  f.exception = (Exception *)0xcd45ab3278235612;
  reader_08.builder.capTable = local_2b0.builder.capTable;
  reader_08.builder.segment = local_2b0.builder.segment;
  reader_08.builder.ptr = local_2b0.builder.ptr;
  reader_08.builder.elementCount = local_2b0.builder.elementCount;
  reader_08.builder.step = local_2b0.builder.step;
  reader_08.builder.structDataSize = local_2b0.builder.structDataSize;
  reader_08.builder.structPointerCount = local_2b0.builder.structPointerCount;
  reader_08.builder.elementSize = local_2b0.builder.elementSize;
  reader_08.builder._39_1_ = local_2b0.builder._39_1_;
  expected_13._M_len = 4;
  expected_13._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_08,expected_13);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_2d8,(Builder *)&l);
  f.exception = (Exception *)0x2934782317595612;
  reader_09.builder.capTable = local_2d8.builder.capTable;
  reader_09.builder.segment = local_2d8.builder.segment;
  reader_09.builder.ptr = local_2d8.builder.ptr;
  reader_09.builder.elementCount = local_2d8.builder.elementCount;
  reader_09.builder.step = local_2d8.builder.step;
  reader_09.builder.structDataSize = local_2d8.builder.structDataSize;
  reader_09.builder.structPointerCount = local_2d8.builder.structPointerCount;
  reader_09.builder.elementSize = local_2d8.builder.elementSize;
  reader_09.builder._39_1_ = local_2d8.builder._39_1_;
  expected_14._M_len = 4;
  expected_14._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_09,expected_14);
  f.exception = (Exception *)&PTR_run_00391dc0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x494,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391df0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x495,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = (SegmentBuilder *)0x2934782317595612;
  l.builder.capTable = (CapTableBuilder *)0x1a39cd455923ab32;
  reader_36.reader.structPointerCount = orig.reader.structPointerCount;
  reader_36.reader.structDataSize = orig.reader.structDataSize;
  reader_36.reader.elementSize = orig.reader.elementSize;
  reader_36.reader._39_1_ = orig.reader._39_1_;
  reader_36.reader._44_4_ = orig.reader._44_4_;
  reader_36.reader.nestingLimit = orig.reader.nestingLimit;
  reader_36.reader.capTable = orig.reader.capTable;
  reader_36.reader.segment = orig.reader.segment;
  reader_36.reader.ptr = orig.reader.ptr;
  reader_36.reader.elementCount = orig.reader.elementCount;
  reader_36.reader.step = orig.reader.step;
  expected_15._M_len = 4;
  expected_15._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_36,expected_15);
  f.exception = (Exception *)0x17595612;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  root_03._builder.capTable = root._builder.capTable;
  root_03._builder.segment = root._builder.segment;
  root_03._builder.data = root._builder.data;
  root_03._builder.pointers = root._builder.pointers;
  root_03._builder.dataSize = root._builder.dataSize;
  root_03._builder.pointerCount = root._builder.pointerCount;
  root_03._builder._38_2_ = root._builder._38_2_;
  expectedData_02._M_len = 4;
  expectedData_02._M_array = (iterator)&f;
  expectedPointers_02._M_len = 1;
  expectedPointers_02._M_array = (iterator)&l;
  checkUpgradedList(root_03,expectedData_02,expectedPointers_02);
  l.builder.segment = (SegmentBuilder *)0x0;
  l.builder.capTable = (CapTableBuilder *)0x0;
  reader_37.reader.structPointerCount = orig.reader.structPointerCount;
  reader_37.reader.structDataSize = orig.reader.structDataSize;
  reader_37.reader.elementSize = orig.reader.elementSize;
  reader_37.reader._39_1_ = orig.reader._39_1_;
  reader_37.reader._44_4_ = orig.reader._44_4_;
  reader_37.reader.nestingLimit = orig.reader.nestingLimit;
  reader_37.reader.capTable = orig.reader.capTable;
  reader_37.reader.segment = orig.reader.segment;
  reader_37.reader.ptr = orig.reader.ptr;
  reader_37.reader.elementCount = orig.reader.elementCount;
  reader_37.reader.step = orig.reader.step;
  expected_16._M_len = 4;
  expected_16._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_37,expected_16);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)0x1234abcd8735fe21;
  orig.reader.capTable = (CapTableReader *)0x7173bc0e1923af36;
  builder_04.capTable = root._builder.capTable;
  builder_04.segment = root._builder.segment;
  builder_04.pointer = root._builder.pointers;
  value_10.size_ = 2;
  value_10.ptr = (unsigned_long *)&orig;
  PointerHelpers<capnp::List<unsigned_long,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_04,value_10);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> *)&orig,(Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_300,(Builder *)&l);
  reader_10.builder.capTable = local_300.builder.capTable;
  reader_10.builder.segment = local_300.builder.segment;
  reader_10.builder.ptr = local_300.builder.ptr;
  reader_10.builder.elementCount = local_300.builder.elementCount;
  reader_10.builder.step = local_300.builder.step;
  reader_10.builder.structDataSize = local_300.builder.structDataSize;
  reader_10.builder.structPointerCount = local_300.builder.structPointerCount;
  reader_10.builder.elementSize = local_300.builder.elementSize;
  reader_10.builder._39_1_ = local_300.builder._39_1_;
  expected_17._M_len = 2;
  expected_17._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_10,expected_17);
  f.exception = (Exception *)&PTR_run_00391e20;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4a2,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_328,(Builder *)&l);
  f.exception._0_2_ = 0x3621;
  reader_11.builder.capTable = local_328.builder.capTable;
  reader_11.builder.segment = local_328.builder.segment;
  reader_11.builder.ptr = local_328.builder.ptr;
  reader_11.builder.elementCount = local_328.builder.elementCount;
  reader_11.builder.step = local_328.builder.step;
  reader_11.builder.structDataSize = local_328.builder.structDataSize;
  reader_11.builder.structPointerCount = local_328.builder.structPointerCount;
  reader_11.builder.elementSize = local_328.builder.elementSize;
  reader_11.builder._39_1_ = local_328.builder._39_1_;
  expected_18._M_len = 2;
  expected_18._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_11,expected_18);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_350,(Builder *)&l);
  f.exception._0_4_ = 0xaf36fe21;
  reader_12.builder.capTable = local_350.builder.capTable;
  reader_12.builder.segment = local_350.builder.segment;
  reader_12.builder.ptr = local_350.builder.ptr;
  reader_12.builder.elementCount = local_350.builder.elementCount;
  reader_12.builder.step = local_350.builder.step;
  reader_12.builder.structDataSize = local_350.builder.structDataSize;
  reader_12.builder.structPointerCount = local_350.builder.structPointerCount;
  reader_12.builder.elementSize = local_350.builder.elementSize;
  reader_12.builder._39_1_ = local_350.builder._39_1_;
  expected_19._M_len = 2;
  expected_19._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_12,expected_19);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_378,(Builder *)&l);
  f.exception = (Exception *)0x1923af368735fe21;
  reader_13.builder.capTable = local_378.builder.capTable;
  reader_13.builder.segment = local_378.builder.segment;
  reader_13.builder.ptr = local_378.builder.ptr;
  reader_13.builder.elementCount = local_378.builder.elementCount;
  reader_13.builder.step = local_378.builder.step;
  reader_13.builder.structDataSize = local_378.builder.structDataSize;
  reader_13.builder.structPointerCount = local_378.builder.structPointerCount;
  reader_13.builder.elementSize = local_378.builder.elementSize;
  reader_13.builder._39_1_ = local_378.builder._39_1_;
  expected_20._M_len = 2;
  expected_20._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_13,expected_20);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_3a0,(Builder *)&l);
  f.exception = (Exception *)0x1234abcd8735fe21;
  reader_14.builder.capTable = local_3a0.builder.capTable;
  reader_14.builder.segment = local_3a0.builder.segment;
  reader_14.builder.ptr = local_3a0.builder.ptr;
  reader_14.builder.elementCount = local_3a0.builder.elementCount;
  reader_14.builder.step = local_3a0.builder.step;
  reader_14.builder.structDataSize = local_3a0.builder.structDataSize;
  reader_14.builder.structPointerCount = local_3a0.builder.structPointerCount;
  reader_14.builder.elementSize = local_3a0.builder.elementSize;
  reader_14.builder._39_1_ = local_3a0.builder._39_1_;
  expected_21._M_len = 2;
  expected_21._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_14,expected_21);
  f.exception = (Exception *)&PTR_run_00391e50;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4a7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = (SegmentBuilder *)0x1234abcd8735fe21;
  l.builder.capTable = (CapTableBuilder *)0x7173bc0e1923af36;
  reader_38.reader.structPointerCount = orig.reader.structPointerCount;
  reader_38.reader.structDataSize = orig.reader.structDataSize;
  reader_38.reader.elementSize = orig.reader.elementSize;
  reader_38.reader._39_1_ = orig.reader._39_1_;
  reader_38.reader._44_4_ = orig.reader._44_4_;
  reader_38.reader.nestingLimit = orig.reader.nestingLimit;
  reader_38.reader.capTable = orig.reader.capTable;
  reader_38.reader.segment = orig.reader.segment;
  reader_38.reader.ptr = orig.reader.ptr;
  reader_38.reader.elementCount = orig.reader.elementCount;
  reader_38.reader.step = orig.reader.step;
  expected_22._M_len = 2;
  expected_22._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_38,expected_22);
  f.exception = (Exception *)0x1234abcd8735fe21;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  root_04._builder.capTable = root._builder.capTable;
  root_04._builder.segment = root._builder.segment;
  root_04._builder.data = root._builder.data;
  root_04._builder.pointers = root._builder.pointers;
  root_04._builder.dataSize = root._builder.dataSize;
  root_04._builder.pointerCount = root._builder.pointerCount;
  root_04._builder._38_2_ = root._builder._38_2_;
  expectedData_03._M_len = 2;
  expectedData_03._M_array = (iterator)&f;
  expectedPointers_03._M_len = 1;
  expectedPointers_03._M_array = (iterator)&l;
  checkUpgradedList(root_04,expectedData_03,expectedPointers_03);
  l.builder.segment = (SegmentBuilder *)0x0;
  l.builder.capTable = (CapTableBuilder *)0x0;
  reader_39.reader.structPointerCount = orig.reader.structPointerCount;
  reader_39.reader.structDataSize = orig.reader.structDataSize;
  reader_39.reader.elementSize = orig.reader.elementSize;
  reader_39.reader._39_1_ = orig.reader._39_1_;
  reader_39.reader._44_4_ = orig.reader._44_4_;
  reader_39.reader.nestingLimit = orig.reader.nestingLimit;
  reader_39.reader.capTable = orig.reader.capTable;
  reader_39.reader.segment = orig.reader.segment;
  reader_39.reader.ptr = orig.reader.ptr;
  reader_39.reader.elementCount = orig.reader.elementCount;
  reader_39.reader.step = orig.reader.step;
  expected_23._M_len = 2;
  expected_23._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_39,expected_23);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  builder_05.capTable = root._builder.capTable;
  builder_05.segment = root._builder.segment;
  builder_05.pointer = root._builder.pointers;
  value_11.size_ = 3;
  value_11.ptr = (Reader *)&l;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_05,value_11)
  ;
  StructBuilder::asReader(&root._builder);
  pcVar4 = (char *)0x7fffffff;
  if (l.builder.structPointerCount != 0) {
    pcVar4 = (char *)0x4;
  }
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)&orig,(Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_3c8,(Builder *)&l);
  reader_15.builder.capTable = local_3c8.builder.capTable;
  reader_15.builder.segment = local_3c8.builder.segment;
  reader_15.builder.ptr = local_3c8.builder.ptr;
  reader_15.builder.elementCount = local_3c8.builder.elementCount;
  reader_15.builder.step = local_3c8.builder.step;
  reader_15.builder.structDataSize = local_3c8.builder.structDataSize;
  reader_15.builder.structPointerCount = local_3c8.builder.structPointerCount;
  reader_15.builder.elementSize = local_3c8.builder.elementSize;
  reader_15.builder._39_1_ = local_3c8.builder._39_1_;
  expected_24._M_len = 3;
  expected_24._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_15,expected_24);
  f.exception = (Exception *)&PTR_run_00391e80;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b4,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391eb0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[115]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b5,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
               ,(char (*) [115])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391ee0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b6,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391f10;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)&PTR_run_00391f40;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar4 = 
    "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
    ;
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4b8,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  f.exception = (Exception *)root._builder.segment;
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_3f0,(Builder *)&f);
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  reader_16.builder.capTable = local_3f0.builder.capTable;
  reader_16.builder.segment = local_3f0.builder.segment;
  reader_16.builder.ptr = local_3f0.builder.ptr;
  reader_16.builder.elementCount = local_3f0.builder.elementCount;
  reader_16.builder.step = local_3f0.builder.step;
  reader_16.builder.structDataSize = local_3f0.builder.structDataSize;
  reader_16.builder.structPointerCount = local_3f0.builder.structPointerCount;
  reader_16.builder.elementSize = local_3f0.builder.elementSize;
  reader_16.builder._39_1_ = local_3f0.builder._39_1_;
  expected_25._M_len = 3;
  expected_25._M_array = (iterator)&l;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_16,expected_25);
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  reader_40.reader.structPointerCount = orig.reader.structPointerCount;
  reader_40.reader.structDataSize = orig.reader.structDataSize;
  reader_40.reader.elementSize = orig.reader.elementSize;
  reader_40.reader._39_1_ = orig.reader._39_1_;
  reader_40.reader._44_4_ = orig.reader._44_4_;
  reader_40.reader.nestingLimit = orig.reader.nestingLimit;
  reader_40.reader.capTable = orig.reader.capTable;
  reader_40.reader.segment = orig.reader.segment;
  reader_40.reader.ptr = orig.reader.ptr;
  reader_40.reader.elementCount = orig.reader.elementCount;
  reader_40.reader.step = orig.reader.step;
  expected_26._M_len = 3;
  expected_26._M_array = (iterator)&l;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_40,expected_26);
  f.exception = (Exception *)0x0;
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  root_05._builder.capTable = root._builder.capTable;
  root_05._builder.segment = root._builder.segment;
  root_05._builder.data = root._builder.data;
  root_05._builder.pointers = root._builder.pointers;
  root_05._builder.dataSize = root._builder.dataSize;
  root_05._builder.pointerCount = root._builder.pointerCount;
  root_05._builder._38_2_ = root._builder._38_2_;
  expectedData_04._M_len = 3;
  expectedData_04._M_array = (iterator)&f;
  expectedPointers_04._M_len = (size_type)pcVar4;
  expectedPointers_04._M_array = (iterator)&l;
  checkUpgradedList(root_05,expectedData_04,expectedPointers_04);
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  reader_41.reader.structPointerCount = orig.reader.structPointerCount;
  reader_41.reader.structDataSize = orig.reader.structDataSize;
  reader_41.reader.elementSize = orig.reader.elementSize;
  reader_41.reader._39_1_ = orig.reader._39_1_;
  reader_41.reader._44_4_ = orig.reader._44_4_;
  reader_41.reader.nestingLimit = orig.reader.nestingLimit;
  reader_41.reader.capTable = orig.reader.capTable;
  reader_41.reader.segment = orig.reader.segment;
  reader_41.reader.ptr = orig.reader.ptr;
  reader_41.reader.elementCount = orig.reader.elementCount;
  reader_41.reader.step = orig.reader.step;
  expected_27._M_len = 3;
  expected_27._M_array = (iterator)&l;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_41,expected_27);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            (&l,(Builder *)&orig,3);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  orig.reader.ptr[0] = 0xef;
  orig.reader.ptr[1] = 0xcd;
  orig.reader.ptr[2] = 0xab;
  orig.reader.ptr[3] = 0x90;
  orig.reader.ptr[4] = 'x';
  orig.reader.ptr[5] = 'V';
  orig.reader.ptr[6] = '4';
  orig.reader.ptr[7] = '\x12';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  orig.reader.ptr[0] = 0xf1;
  orig.reader.ptr[1] = 0xde;
  orig.reader.ptr[2] = 0xbc;
  orig.reader.ptr[3] = '\n';
  orig.reader.ptr[4] = 0x89;
  orig.reader.ptr[5] = 'g';
  orig.reader.ptr[6] = 'E';
  orig.reader.ptr[7] = '#';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  orig.reader.ptr[0] = '\x12';
  orig.reader.ptr[1] = 0xef;
  orig.reader.ptr[2] = 0xcd;
  orig.reader.ptr[3] = 0xab;
  orig.reader.ptr[4] = 0x90;
  orig.reader.ptr[5] = 'x';
  orig.reader.ptr[6] = 'V';
  orig.reader.ptr[7] = '4';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)&orig,value);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)&orig,value_00);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "baz";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)&orig,value_01);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (l.builder.structPointerCount != 0) {
    f.exception._0_4_ = l.builder.segment._0_4_;
    f.exception._4_4_ = l.builder.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)&orig,
             (Reader *)&f);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_418,(Builder *)&l);
  reader_17.builder.capTable = local_418.builder.capTable;
  reader_17.builder.segment = local_418.builder.segment;
  reader_17.builder.ptr = local_418.builder.ptr;
  reader_17.builder.elementCount = local_418.builder.elementCount;
  reader_17.builder.step = local_418.builder.step;
  reader_17.builder.structDataSize = local_418.builder.structDataSize;
  reader_17.builder.structPointerCount = local_418.builder.structPointerCount;
  reader_17.builder.elementSize = local_418.builder.elementSize;
  reader_17.builder._39_1_ = local_418.builder._39_1_;
  expected_28._M_len = 3;
  expected_28._M_array = (iterator)&f;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_17,expected_28);
  f.exception = (Exception *)&PTR_run_00391f70;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4cf,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_440,(Builder *)&l);
  f.exception._0_3_ = 0x12f1ef;
  reader_18.builder.capTable = local_440.builder.capTable;
  reader_18.builder.segment = local_440.builder.segment;
  reader_18.builder.ptr = local_440.builder.ptr;
  reader_18.builder.elementCount = local_440.builder.elementCount;
  reader_18.builder.step = local_440.builder.step;
  reader_18.builder.structDataSize = local_440.builder.structDataSize;
  reader_18.builder.structPointerCount = local_440.builder.structPointerCount;
  reader_18.builder.elementSize = local_440.builder.elementSize;
  reader_18.builder._39_1_ = local_440.builder._39_1_;
  expected_29._M_len = 3;
  expected_29._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_18,expected_29);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_468,(Builder *)&l);
  f.exception._0_6_ = 0xef12def1cdef;
  reader_19.builder.capTable = local_468.builder.capTable;
  reader_19.builder.segment = local_468.builder.segment;
  reader_19.builder.ptr = local_468.builder.ptr;
  reader_19.builder.elementCount = local_468.builder.elementCount;
  reader_19.builder.step = local_468.builder.step;
  reader_19.builder.structDataSize = local_468.builder.structDataSize;
  reader_19.builder.structPointerCount = local_468.builder.structPointerCount;
  reader_19.builder.elementSize = local_468.builder.elementSize;
  reader_19.builder._39_1_ = local_468.builder._39_1_;
  expected_30._M_len = 3;
  expected_30._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_19,expected_30);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_490,(Builder *)&l);
  f.exception = (Exception *)0xabcdef190abcdef;
  reader_20.builder.capTable = local_490.builder.capTable;
  reader_20.builder.segment = local_490.builder.segment;
  reader_20.builder.ptr = local_490.builder.ptr;
  reader_20.builder.elementCount = local_490.builder.elementCount;
  reader_20.builder.step = local_490.builder.step;
  reader_20.builder.structDataSize = local_490.builder.structDataSize;
  reader_20.builder.structPointerCount = local_490.builder.structPointerCount;
  reader_20.builder.elementSize = local_490.builder.elementSize;
  reader_20.builder._39_1_ = local_490.builder._39_1_;
  expected_31._M_len = 3;
  expected_31._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_20,expected_31);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_4b8,(Builder *)&l);
  f.exception = (Exception *)0x1234567890abcdef;
  reader_21.builder.capTable = local_4b8.builder.capTable;
  reader_21.builder.segment = local_4b8.builder.segment;
  reader_21.builder.ptr = local_4b8.builder.ptr;
  reader_21.builder.elementCount = local_4b8.builder.elementCount;
  reader_21.builder.step = local_4b8.builder.step;
  reader_21.builder.structDataSize = local_4b8.builder.structDataSize;
  reader_21.builder.structPointerCount = local_4b8.builder.structPointerCount;
  reader_21.builder.elementSize = local_4b8.builder.elementSize;
  reader_21.builder._39_1_ = local_4b8.builder._39_1_;
  expected_32._M_len = 3;
  expected_32._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_21,expected_32);
  f.exception = (Exception *)root._builder.segment;
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_4e0,(Builder *)&f);
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  reader_22.builder.capTable = local_4e0.builder.capTable;
  reader_22.builder.segment = local_4e0.builder.segment;
  reader_22.builder.ptr = local_4e0.builder.ptr;
  reader_22.builder.elementCount = local_4e0.builder.elementCount;
  reader_22.builder.step = local_4e0.builder.step;
  reader_22.builder.structDataSize = local_4e0.builder.structDataSize;
  reader_22.builder.structPointerCount = local_4e0.builder.structPointerCount;
  reader_22.builder.elementSize = local_4e0.builder.elementSize;
  reader_22.builder._39_1_ = local_4e0.builder._39_1_;
  expected_33._M_len = 3;
  expected_33._M_array = (iterator)&l;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_22,expected_33);
  f.exception = (Exception *)0x1234567890abcdef;
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  reader_42.reader.structPointerCount = orig.reader.structPointerCount;
  reader_42.reader.structDataSize = orig.reader.structDataSize;
  reader_42.reader.elementSize = orig.reader.elementSize;
  reader_42.reader._39_1_ = orig.reader._39_1_;
  reader_42.reader._44_4_ = orig.reader._44_4_;
  reader_42.reader.nestingLimit = orig.reader.nestingLimit;
  sVar5 = 3;
  reader_42.reader.capTable = orig.reader.capTable;
  reader_42.reader.segment = orig.reader.segment;
  reader_42.reader.ptr = orig.reader.ptr;
  reader_42.reader.elementCount = orig.reader.elementCount;
  reader_42.reader.step = orig.reader.step;
  expectedData_05._M_len = 3;
  expectedData_05._M_array = (iterator)&f;
  expectedPointers_05._M_len = 3;
  expectedPointers_05._M_array = (iterator)&l;
  checkList(reader_42,expectedData_05,expectedPointers_05);
  f.exception = (Exception *)0x1234567890abcdef;
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  root_06._builder.capTable = root._builder.capTable;
  root_06._builder.segment = root._builder.segment;
  root_06._builder.data = root._builder.data;
  root_06._builder.pointers = root._builder.pointers;
  root_06._builder.dataSize = root._builder.dataSize;
  root_06._builder.pointerCount = root._builder.pointerCount;
  root_06._builder._38_2_ = root._builder._38_2_;
  expectedData_06._M_len = 3;
  expectedData_06._M_array = (iterator)&f;
  expectedPointers_06._M_len = sVar5;
  expectedPointers_06._M_array = (iterator)&l;
  checkUpgradedList(root_06,expectedData_06,expectedPointers_06);
  f.exception = (Exception *)0x0;
  l.builder.segment = (SegmentBuilder *)0x32afa1;
  l.builder.capTable = (CapTableBuilder *)0x1;
  l.builder.ptr = "";
  l.builder.elementCount = 1;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"\n\n" + 2;
  reader_43.reader.structPointerCount = orig.reader.structPointerCount;
  reader_43.reader.structDataSize = orig.reader.structDataSize;
  reader_43.reader.elementSize = orig.reader.elementSize;
  reader_43.reader._39_1_ = orig.reader._39_1_;
  reader_43.reader._44_4_ = orig.reader._44_4_;
  reader_43.reader.nestingLimit = orig.reader.nestingLimit;
  reader_43.reader.capTable = orig.reader.capTable;
  reader_43.reader.segment = orig.reader.segment;
  reader_43.reader.ptr = orig.reader.ptr;
  reader_43.reader.elementCount = orig.reader.elementCount;
  reader_43.reader.step = orig.reader.step;
  expectedData_07._M_len = 3;
  expectedData_07._M_array = (iterator)&f;
  expectedPointers_07._M_len = 3;
  expectedPointers_07._M_array = (iterator)&l;
  checkList(reader_43,expectedData_07,expectedPointers_07);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)0x4e00380022000c;
  builder_06.capTable = root._builder.capTable;
  builder_06.segment = root._builder.segment;
  builder_06.pointer = root._builder.pointers;
  value_12.size_ = 4;
  value_12.ptr = (unsigned_short *)&orig;
  PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_06,value_12);
  StructBuilder::asReader(&root._builder);
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  if (orig.reader.structPointerCount != 0) {
    f.exception._0_4_ = orig.reader.segment._0_4_;
    f.exception._4_4_ = orig.reader.segment._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> *)&l,(Reader *)&f);
  orig.reader.segment = (SegmentReader *)0x4e00380022000c;
  reader_44.reader.capTable = &(l.builder.capTable)->super_CapTableReader;
  reader_44.reader.segment = &(l.builder.segment)->super_SegmentReader;
  reader_44.reader.ptr = l.builder.ptr;
  reader_44.reader.elementCount = l.builder.elementCount;
  reader_44.reader.step = l.builder.step;
  reader_44.reader.structDataSize = l.builder.structDataSize;
  reader_44.reader.structPointerCount = l.builder.structPointerCount;
  reader_44.reader.elementSize = l.builder.elementSize;
  reader_44.reader._39_1_ = l.builder._39_1_;
  reader_44.reader._40_8_ = 1;
  expected_34._M_len = 4;
  expected_34._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_44,expected_34);
  pWVar1 = root._builder.pointers;
  f.exception = (Exception *)root._builder.segment;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_>
              *)&orig,(Builder *)&f);
  f.exception = (Exception *)0x0;
  reader_45.reader.capTable = &(l.builder.capTable)->super_CapTableReader;
  reader_45.reader.segment = &(l.builder.segment)->super_SegmentReader;
  reader_45.reader.ptr = l.builder.ptr;
  reader_45.reader.elementCount = l.builder.elementCount;
  reader_45.reader.step = l.builder.step;
  reader_45.reader.structDataSize = l.builder.structDataSize;
  reader_45.reader.structPointerCount = l.builder.structPointerCount;
  reader_45.reader.elementSize = l.builder.elementSize;
  reader_45.reader._39_1_ = l.builder._39_1_;
  reader_45.reader._40_8_ = 1;
  expected_35._M_len = 4;
  expected_35._M_array = (iterator)&f;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_45,expected_35);
  if (orig.reader.elementCount != 4) {
    local_81c = 4;
    local_78c = orig.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4ea,FAILED,"(4u) == (l.size())","4u, l.size()",&local_81c,&local_78c);
    kj::_::Debug::Fault::fatal(&f);
  }
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,0);
  if (((pWVar1->offsetAndKind).value != 0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_81c = 0xc;
    ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,0);
    local_78c = (pWVar1->offsetAndKind).value;
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4eb,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_81c,&local_78c);
  }
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,1);
  if (((pWVar1->offsetAndKind).value != 0x22) && (kj::_::Debug::minSeverity < 3)) {
    local_81c = 0x22;
    ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,1);
    local_78c = (pWVar1->offsetAndKind).value;
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4ec,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_81c,&local_78c);
  }
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,2);
  if (((pWVar1->offsetAndKind).value != 0x38) && (kj::_::Debug::minSeverity < 3)) {
    local_81c = 0x38;
    ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,2);
    local_78c = (pWVar1->offsetAndKind).value;
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4ed,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_81c,&local_78c);
  }
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,3);
  if (((pWVar1->offsetAndKind).value != 0x4e) && (kj::_::Debug::minSeverity < 3)) {
    local_81c = 0x4e;
    ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,3);
    local_78c = (pWVar1->offsetAndKind).value;
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4ee,ERROR,"\"failed: expected \" \"(78u) == (l[3].getF())\", 78u, l[3].getF()",
               (char (*) [40])"failed: expected (78u) == (l[3].getF())",&local_81c,&local_78c);
  }
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,0);
  (pWVar1->offsetAndKind).value = 0x65ac1235;
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,1);
  (pWVar1->offsetAndKind).value = 0x13f12879;
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,2);
  (pWVar1->offsetAndKind).value = 0x33423082;
  ListBuilder::getStructElement((StructBuilder *)&f,(ListBuilder *)&orig,3);
  (pWVar1->offsetAndKind).value = 0x12988948;
  orig.reader.segment = (SegmentReader *)&PTR_run_00391fa0;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4f4,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_508,(Builder *)&l);
  orig.reader.segment = (SegmentReader *)CONCAT44(orig.reader.segment._4_4_,0x48827935);
  reader_23.builder.capTable = local_508.builder.capTable;
  reader_23.builder.segment = local_508.builder.segment;
  reader_23.builder.ptr = local_508.builder.ptr;
  reader_23.builder.elementCount = local_508.builder.elementCount;
  reader_23.builder.step = local_508.builder.step;
  reader_23.builder.structDataSize = local_508.builder.structDataSize;
  reader_23.builder.structPointerCount = local_508.builder.structPointerCount;
  reader_23.builder.elementSize = local_508.builder.elementSize;
  reader_23.builder._39_1_ = local_508.builder._39_1_;
  expected_36._M_len = 4;
  expected_36._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_23,expected_36);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_530,(Builder *)&l);
  orig.reader.segment = (SegmentReader *)0x8948308228791235;
  reader_24.builder.capTable = local_530.builder.capTable;
  reader_24.builder.segment = local_530.builder.segment;
  reader_24.builder.ptr = local_530.builder.ptr;
  reader_24.builder.elementCount = local_530.builder.elementCount;
  reader_24.builder.step = local_530.builder.step;
  reader_24.builder.structDataSize = local_530.builder.structDataSize;
  reader_24.builder.structPointerCount = local_530.builder.structPointerCount;
  reader_24.builder.elementSize = local_530.builder.elementSize;
  reader_24.builder._39_1_ = local_530.builder._39_1_;
  expected_37._M_len = 4;
  expected_37._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_24,expected_37);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_558,(Builder *)&l);
  orig.reader.segment = (SegmentReader *)0x13f1287965ac1235;
  orig.reader.capTable = (CapTableReader *)0x1298894833423082;
  reader_25.builder.capTable = local_558.builder.capTable;
  reader_25.builder.segment = local_558.builder.segment;
  reader_25.builder.ptr = local_558.builder.ptr;
  reader_25.builder.elementCount = local_558.builder.elementCount;
  reader_25.builder.step = local_558.builder.step;
  reader_25.builder.structDataSize = local_558.builder.structDataSize;
  reader_25.builder.structPointerCount = local_558.builder.structPointerCount;
  reader_25.builder.elementSize = local_558.builder.elementSize;
  reader_25.builder._39_1_ = local_558.builder._39_1_;
  expected_38._M_len = 4;
  expected_38._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_25,expected_38);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_580,(Builder *)&orig)
  ;
  l.builder.ptr = (byte *)0x33423082;
  l.builder.elementCount = 0x12988948;
  l.builder.step = 0;
  l.builder.segment = (SegmentBuilder *)0x65ac1235;
  l.builder.capTable = (CapTableBuilder *)0x13f12879;
  reader_26.builder.capTable = local_580.builder.capTable;
  reader_26.builder.segment = local_580.builder.segment;
  reader_26.builder.ptr = local_580.builder.ptr;
  reader_26.builder.elementCount = local_580.builder.elementCount;
  reader_26.builder.step = local_580.builder.step;
  reader_26.builder.structDataSize = local_580.builder.structDataSize;
  reader_26.builder.structPointerCount = local_580.builder.structPointerCount;
  reader_26.builder.elementSize = local_580.builder.elementSize;
  reader_26.builder._39_1_ = local_580.builder._39_1_;
  expected_39._M_len = 4;
  expected_39._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_26,expected_39);
  orig.reader.segment = (SegmentReader *)&PTR_run_00391fd0;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4fb,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  list_00._M_len = 4;
  list_00._M_array = (iterator)&orig;
  AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>((Builder *)&l,list_00);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct16,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>_>
              *)&l,(Builder *)&orig);
  if (l.builder.elementCount != 4) {
    f.exception._0_4_ = 4;
    local_81c = l.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&orig,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x501,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&f,&local_81c);
    kj::_::Debug::Fault::fatal((Fault *)&orig);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  if ((*(short *)orig.reader.ptr != 0) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = f.exception & 0xffffffff00000000;
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
    local_81c = CONCAT22(local_81c._2_2_,*(undefined2 *)orig.reader.ptr);
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x502,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
               (char (*) [39])"failed: expected (0u) == (l[0].getF())",(uint *)&f,
               (unsigned_short *)&local_81c);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  if ((*(short *)orig.reader.ptr != 0) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = f.exception & 0xffffffff00000000;
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
    local_81c = CONCAT22(local_81c._2_2_,*(undefined2 *)orig.reader.ptr);
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x503,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
               (char (*) [39])"failed: expected (0u) == (l[1].getF())",(uint *)&f,
               (unsigned_short *)&local_81c);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  if ((*(short *)orig.reader.ptr != 0) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = f.exception & 0xffffffff00000000;
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
    local_81c = CONCAT22(local_81c._2_2_,*(undefined2 *)orig.reader.ptr);
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x504,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
               (char (*) [39])"failed: expected (0u) == (l[2].getF())",(uint *)&f,
               (unsigned_short *)&local_81c);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
  if ((*(short *)orig.reader.ptr != 0) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = f.exception & 0xffffffff00000000;
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
    local_81c = CONCAT22(local_81c._2_2_,*(undefined2 *)orig.reader.ptr);
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x505,ERROR,"\"failed: expected \" \"(0u) == (l[3].getF())\", 0u, l[3].getF()",
               (char (*) [39])"failed: expected (0u) == (l[3].getF())",(uint *)&f,
               (unsigned_short *)&local_81c);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  orig.reader.ptr[0] = '\x1d';
  orig.reader.ptr[1] = '1';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  orig.reader.ptr[0] = 0xb3;
  orig.reader.ptr[1] = '\f';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  orig.reader.ptr[0] = '\x16';
  orig.reader.ptr[1] = '$';
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
  orig.reader.ptr[0] = 200;
  orig.reader.ptr[1] = '\x16';
  orig.reader.segment = (SegmentReader *)&PTR_run_00392000;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x50b,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_5a8,(Builder *)&l);
  orig.reader.segment = (SegmentReader *)0x16c824160cb3311d;
  reader_27.builder.capTable = local_5a8.builder.capTable;
  reader_27.builder.segment = local_5a8.builder.segment;
  reader_27.builder.ptr = local_5a8.builder.ptr;
  reader_27.builder.elementCount = local_5a8.builder.elementCount;
  reader_27.builder.step = local_5a8.builder.step;
  reader_27.builder.structDataSize = local_5a8.builder.structDataSize;
  reader_27.builder.structPointerCount = local_5a8.builder.structPointerCount;
  reader_27.builder.elementSize = local_5a8.builder.elementSize;
  reader_27.builder._39_1_ = local_5a8.builder._39_1_;
  expected_40._M_len = 4;
  expected_40._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_27,expected_40);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_5d0,(Builder *)&l);
  orig.reader.segment = (SegmentReader *)0xcb30000311d;
  orig.reader.capTable = (CapTableReader *)0x16c800002416;
  reader_28.builder.capTable = local_5d0.builder.capTable;
  reader_28.builder.segment = local_5d0.builder.segment;
  reader_28.builder.ptr = local_5d0.builder.ptr;
  reader_28.builder.elementCount = local_5d0.builder.elementCount;
  reader_28.builder.step = local_5d0.builder.step;
  reader_28.builder.structDataSize = local_5d0.builder.structDataSize;
  reader_28.builder.structPointerCount = local_5d0.builder.structPointerCount;
  reader_28.builder.elementSize = local_5d0.builder.elementSize;
  reader_28.builder._39_1_ = local_5d0.builder._39_1_;
  expected_41._M_len = 4;
  expected_41._M_array = (iterator)&orig;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_28,expected_41);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_5f8,(Builder *)&orig)
  ;
  l.builder.ptr = (byte *)0x2416;
  l.builder.elementCount = 0x16c8;
  l.builder.step = 0;
  l.builder.segment = (SegmentBuilder *)0x311d;
  l.builder.capTable = (CapTableBuilder *)0xcb3;
  reader_29.builder.capTable = local_5f8.builder.capTable;
  reader_29.builder.segment = local_5f8.builder.segment;
  reader_29.builder.ptr = local_5f8.builder.ptr;
  reader_29.builder.elementCount = local_5f8.builder.elementCount;
  reader_29.builder.step = local_5f8.builder.step;
  reader_29.builder.structDataSize = local_5f8.builder.structDataSize;
  reader_29.builder.structPointerCount = local_5f8.builder.structPointerCount;
  reader_29.builder.elementSize = local_5f8.builder.elementSize;
  reader_29.builder._39_1_ = local_5f8.builder._39_1_;
  expected_42._M_len = 4;
  expected_42._M_array = (iterator)&l;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_29,expected_42);
  orig.reader.segment = (SegmentReader *)&PTR_run_00392030;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x50f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  list_01._M_len = 4;
  list_01._M_array = (iterator)&orig;
  AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>((Builder *)&l,list_01);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::StructP,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>_>
              *)&l,(Builder *)&orig);
  if (l.builder.elementCount != 4) {
    f.exception._0_4_ = 4;
    local_81c = l.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&orig,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x515,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&f,&local_81c);
    kj::_::Debug::Fault::fatal((Fault *)&orig);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
  bVar3 = operator==("",(Builder *)&f);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
    kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x516,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (l[0].getF())\", \"\", l[0].getF()",
               (char (*) [39])"failed: expected (\"\") == (l[0].getF())",(char (*) [1])0x32afa1,
               (Builder *)&f);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
  bVar3 = operator==("",(Builder *)&f);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
    kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x517,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (l[1].getF())\", \"\", l[1].getF()",
               (char (*) [39])"failed: expected (\"\") == (l[1].getF())",(char (*) [1])0x32afa1,
               (Builder *)&f);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
  bVar3 = operator==("",(Builder *)&f);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
    kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x518,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (l[2].getF())\", \"\", l[2].getF()",
               (char (*) [39])"failed: expected (\"\") == (l[2].getF())",(char (*) [1])0x32afa1,
               (Builder *)&f);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
  capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
  bVar3 = operator==("",(Builder *)&f);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF((Builder *)&f,(Builder *)&orig);
    kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x519,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (l[3].getF())\", \"\", l[3].getF()",
               (char (*) [39])"failed: expected (\"\") == (l[3].getF())",(char (*) [1])0x32afa1,
               (Builder *)&f);
  }
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,0);
  value_02.super_StringPtr.content.size_ = 4;
  value_02.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&orig,value_02);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,1);
  value_03.super_StringPtr.content.size_ = 4;
  value_03.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&orig,value_03);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,2);
  value_04.super_StringPtr.content.size_ = 4;
  value_04.super_StringPtr.content.ptr = "baz";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&orig,value_04);
  ListBuilder::getStructElement((StructBuilder *)&orig,&l.builder,3);
  value_05.super_StringPtr.content.size_ = 4;
  value_05.super_StringPtr.content.ptr = "qux";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&orig,value_05);
  orig.reader.segment = (SegmentReader *)&PTR_run_00392060;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x51f,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_00392090;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x520,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_003920c0;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x521,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = (SegmentReader *)&PTR_run_003920f0;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x522,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
              );
  }
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_620,(Builder *)&orig);
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  reader_30.builder.capTable = local_620.builder.capTable;
  reader_30.builder.segment = local_620.builder.segment;
  reader_30.builder.ptr = local_620.builder.ptr;
  reader_30.builder.elementCount = local_620.builder.elementCount;
  reader_30.builder.step = local_620.builder.step;
  reader_30.builder.structDataSize = local_620.builder.structDataSize;
  reader_30.builder.structPointerCount = local_620.builder.structPointerCount;
  reader_30.builder.elementSize = local_620.builder.elementSize;
  reader_30.builder._39_1_ = local_620.builder._39_1_;
  expected_43._M_len = 4;
  expected_43._M_array = (iterator)&l;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_30,expected_43);
  orig.reader.segment = &(root._builder.segment)->super_SegmentReader;
  orig.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  orig.reader.ptr = (byte *)root._builder.pointers;
  l.builder.segment = (SegmentBuilder *)anon_var_dwarf_6cde;
  l.builder.capTable = (CapTableBuilder *)0x4;
  l.builder.ptr = "bar";
  l.builder.elementCount = 4;
  l.builder.step = 0;
  l.builder._32_8_ = (long)"foobarbaz" + 6;
  builder_07.capTable = root._builder.capTable;
  builder_07.segment = root._builder.segment;
  builder_07.pointer = root._builder.pointers;
  value_13.size_ = 4;
  value_13.ptr = (Reader *)&l;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_07,value_13)
  ;
  orig.reader.segment = (SegmentReader *)&PTR_run_00392120;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x528,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
               ,(char (*) [116])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
              );
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  orig.reader.segment = (SegmentReader *)0x220000000c;
  orig.reader.capTable = (CapTableReader *)0x4e00000038;
  builder_08.capTable = root._builder.capTable;
  builder_08.segment = root._builder.segment;
  builder_08.pointer = root._builder.pointers;
  value_14.size_ = 4;
  value_14.ptr = (uint *)&orig;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_08,value_14);
  orig.reader.segment = (SegmentReader *)&PTR_run_00392150;
  orig.reader.capTable = (CapTableReader *)&root._builder;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&orig);
  cVar2 = (char)l.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x52a,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, UpgradeListInBuilder) {
  // Test every damned list upgrade.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  // -----------------------------------------------------------------

  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
  checkUpgradedList(root, {0, 0, 0, 0}, {"", "", "", ""});

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});
    auto orig = root.asReader().getAnyPointerField().getAs<List<bool>>();
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Void>>());
    checkList(root.getAnyPointerField().getAs<List<bool>>(), {true, false, true, true});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {true, false, true, true});

    // Can't upgrade bit lists. (This used to be supported.)
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<test::TestNewVersion>>());
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint8_t>>({0x12, 0x23, 0x33, 0x44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint8_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x12, 0x23, 0x33, 0x44});
    checkUpgradedList(root, {0x12, 0x23, 0x33, 0x44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint16_t>>({0x5612, 0x7823, 0xab33, 0xcd44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab33, 0xcd44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x5612, 0x7823, 0xab33, 0xcd44});
    checkUpgradedList(root, {0x5612, 0x7823, 0xab33, 0xcd44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x32, 0x45});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab32, 0xcd45});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    checkUpgradedList(root, {0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45}, {"", "", "", ""});
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint64_t>>({0x1234abcd8735fe21, 0x7173bc0e1923af36});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint64_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x21, 0x36});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xfe21, 0xaf36});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x8735fe21u, 0x1923af36u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    checkUpgradedList(root, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull}, {"", ""});
    checkList(orig, {0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz"});
    auto orig = root.asReader().getAnyPointerField().getAs<List<Text>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {"foo", "bar", "baz"});
    checkUpgradedList(root, {0, 0, 0}, {"foo", "bar", "baz"});
    checkList(orig, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    {
      auto l = root.getAnyPointerField().initAs<List<test::TestOldVersion>>(3);
      l[0].setOld1(0x1234567890abcdef);
      l[1].setOld1(0x234567890abcdef1);
      l[2].setOld1(0x34567890abcdef12);
      l[0].setOld2("foo");
      l[1].setOld2("bar");
      l[2].setOld2("baz");
    }
    auto orig = root.asReader().getAnyPointerField().getAs<List<test::TestOldVersion>>();

    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0xefu, 0xf1u, 0x12u});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xcdefu, 0xdef1u, 0xef12u});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x90abcdefu, 0x0abcdef1u, 0xabcdef12u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
              {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull});
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                    {"foo", "bar", "baz"});
    checkUpgradedList(root, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                            {"foo", "bar", "baz"});
    checkList(orig, {0u, 0u, 0u}, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------
  // OK, now we've tested upgrading every primitive list to every primitive list, every primitive
  // list to a multi-word struct, and a multi-word struct to every primitive list.  But we haven't
  // tried upgrading primitive lists to sub-word structs.

  // Upgrade from multi-byte, sub-word data.
  root.getAnyPointerField().setAs<List<uint16_t>>({12u, 34u, 56u, 78u});
  {
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(orig, {12u, 34u, 56u, 78u});
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
    EXPECT_EQ(78u, l[3].getF());
    l[0].setF(0x65ac1235u);
    l[1].setF(0x13f12879u);
    l[2].setF(0x33423082u);
    l[3].setF(0x12988948u);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x35u, 0x79u, 0x82u, 0x48u});
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x1235u, 0x2879u, 0x3082u, 0x8948u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> data struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct16>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
    EXPECT_EQ(0u, l[3].getF());
    l[0].setF(12573);
    l[1].setF(3251);
    l[2].setF(9238);
    l[3].setF(5832);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {12573u, 3251u, 9238u, 5832u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> pointer struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::StructP>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ("", l[0].getF());
    EXPECT_EQ("", l[1].getF());
    EXPECT_EQ("", l[2].getF());
    EXPECT_EQ("", l[3].getF());
    l[0].setF("foo");
    l[1].setF("bar");
    l[2].setF("baz");
    l[3].setF("qux");
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz", "qux"});

  // Verify that we cannot "side-grade" a pointer list to a data list, or a data list to
  // a pointer struct list.
  root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz", "qux"});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56, 78});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
}